

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

JobProcessor * __thiscall ThreadContext::GetJobProcessor(ThreadContext *this)

{
  HeapAllocator *pHVar1;
  BackgroundJobProcessor *this_00;
  AllocationPolicyManager *policyManager;
  JobProcessor *this_01;
  TrackAllocData local_98;
  code *local_50;
  undefined8 local_48;
  TrackAllocData local_40;
  ThreadContext *local_18;
  ThreadContext *this_local;
  
  local_18 = this;
  if (((this->bgJit & 1U) == 0) || ((this->isOptimizedForManyInstances & 1U) == 0)) {
    if (this->jobProcessor == (JobProcessor *)0x0) {
      if (((this->bgJit & 1U) == 0) || ((this->isOptimizedForManyInstances & 1U) != 0)) {
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_98,(type_info *)&JsUtil::ForegroundJobProcessor::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                   ,0x556);
        pHVar1 = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_98);
        this_01 = (JobProcessor *)new<Memory::HeapAllocator>(0x38,pHVar1,0x350bd0);
        JsUtil::ForegroundJobProcessor::ForegroundJobProcessor((ForegroundJobProcessor *)this_01);
        this->jobProcessor = this_01;
      }
      else {
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_40,(type_info *)&JsUtil::BackgroundJobProcessor::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                   ,0x552);
        pHVar1 = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_40);
        local_50 = Memory::HeapAllocator::Alloc;
        local_48 = 0;
        this_00 = (BackgroundJobProcessor *)new<Memory::HeapAllocator>(0xb0,pHVar1,0x350bd0);
        policyManager = GetAllocationPolicyManager(this);
        JsUtil::BackgroundJobProcessor::BackgroundJobProcessor
                  (this_00,policyManager,&this->threadService,false);
        this->jobProcessor = (JobProcessor *)this_00;
      }
    }
    this_local = (ThreadContext *)this->jobProcessor;
  }
  else {
    this_local = (ThreadContext *)ThreadBoundThreadContextManager::GetSharedJobProcessor();
  }
  return (JobProcessor *)this_local;
}

Assistant:

JsUtil::JobProcessor *
ThreadContext::GetJobProcessor()
{
    if(bgJit && isOptimizedForManyInstances)
    {
        return ThreadBoundThreadContextManager::GetSharedJobProcessor();
    }

    if (!jobProcessor)
    {
        if(bgJit && !isOptimizedForManyInstances)
        {
            jobProcessor = HeapNew(JsUtil::BackgroundJobProcessor, GetAllocationPolicyManager(), &threadService, false /*disableParallelThreads*/);
        }
        else
        {
            jobProcessor = HeapNew(JsUtil::ForegroundJobProcessor);
        }
    }
    return jobProcessor;
}